

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_listen_without_bind(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_pipe_t server;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&server,0);
  if (iVar1 == 0) {
    iVar1 = uv_listen((uv_stream_t *)&server,0x1000,(uv_connection_cb)0x0);
    if (iVar1 == -0x16) {
      uv_close((uv_handle_t *)&server,close_cb);
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      if (close_cb_called == 1) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
        uVar3 = 0x89;
      }
      else {
        pcVar4 = "close_cb_called == 1";
        uVar3 = 0x87;
      }
    }
    else {
      pcVar4 = "r == UV_EINVAL";
      uVar3 = 0x81;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x7e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-bind-error.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(pipe_listen_without_bind) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&server, SOMAXCONN, NULL);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}